

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::String> * __thiscall
asl::Array<asl::String>::insert(Array<asl::String> *this,int k,String *x)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  String *pSVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  
  pSVar5 = this->_a;
  iVar1 = *(int *)&pSVar5[-1].field_2;
  iVar2 = *(int *)((long)&pSVar5[-1].field_2 + 4);
  iVar7 = k;
  if (k < 0) {
    iVar7 = iVar1;
  }
  if (iVar1 < iVar2) {
    paVar4 = &pSVar5[-1].field_2;
LAB_00122be1:
    if (iVar1 - iVar7 != 0 && iVar7 <= iVar1) {
      memmove(pSVar5 + (long)iVar7 + 1,pSVar5 + iVar7,(long)(iVar1 - iVar7) * 0x18);
      pSVar5 = this->_a;
    }
    String::String(pSVar5 + iVar7,x);
    *(int *)paVar4 = iVar1 + 1;
    return this;
  }
  if (iVar1 != 0x7fffffff) {
    dup(this,k);
    uVar3 = *(undefined4 *)((long)&this->_a[-1].field_2 + 8);
    iVar8 = 0x7fffffff;
    if (iVar2 < 0x3ffffffe) {
      iVar8 = iVar2 * 2 + 2;
    }
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)
             realloc(&this->_a[-1].field_2,(long)iVar8 * 0x18 + 0x10);
    if (paVar4 != (anon_union_16_2_78e7fdac_for_String_2 *)0x0) {
      pSVar5 = (String *)(paVar4 + 1);
      this->_a = pSVar5;
      *(int *)((long)paVar4 + 4) = iVar8;
      *(undefined4 *)((long)paVar4 + 8) = uVar3;
      goto LAB_00122be1;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}